

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

Maybe<kj::FsNode::Metadata> * __thiscall
kj::anon_unknown_9::DiskHandle::tryLstat
          (Maybe<kj::FsNode::Metadata> *__return_storage_ptr__,DiskHandle *this,PathPtr path)

{
  Metadata local_130;
  Fault local_e8;
  Fault f;
  undefined1 auStack_d8 [4];
  int error;
  PathPtr *local_d0;
  stat *local_c8;
  int local_bc;
  undefined1 local_b8 [4];
  int _kjSyscallError;
  stat stats;
  DiskHandle *this_local;
  PathPtr path_local;
  
  path_local.parts.ptr = (String *)path.parts.size_;
  this_local = (DiskHandle *)path.parts.ptr;
  local_d0 = (PathPtr *)&this_local;
  local_c8 = (stat *)local_b8;
  _auStack_d8 = this;
  stats.__glibc_reserved[2] = (__syscall_slong_t)this;
  path_local.parts.size_ = (size_t)__return_storage_ptr__;
  f.exception._4_4_ =
       kj::_::Debug::
       syscallError<kj::(anonymous_namespace)::DiskHandle::tryLstat(kj::PathPtr)const::_lambda()_1_>
                 ((anon_class_24_3_cd2b4e9f *)auStack_d8,false);
  local_bc = f.exception._4_4_;
  if (f.exception._4_4_ == 0) {
    statToMetadata(&local_130,(stat *)local_b8);
    Maybe<kj::FsNode::Metadata>::Maybe(__return_storage_ptr__,&local_130);
  }
  else if ((f.exception._4_4_ == 2) || (f.exception._4_4_ == 0x14)) {
    Maybe<kj::FsNode::Metadata>::Maybe(__return_storage_ptr__);
  }
  else {
    kj::_::Debug::Fault::Fault<int,kj::PathPtr&>
              (&local_e8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x2f5,f.exception._4_4_,"faccessat(fd, path)","path",(PathPtr *)&this_local);
    Maybe<kj::FsNode::Metadata>::Maybe(__return_storage_ptr__);
    kj::_::Debug::Fault::~Fault(&local_e8);
  }
  return __return_storage_ptr__;
}

Assistant:

Maybe<FsNode::Metadata> tryLstat(PathPtr path) const {
    struct stat stats;
    KJ_SYSCALL_HANDLE_ERRORS(fstatat(fd, path.toString().cStr(), &stats, AT_SYMLINK_NOFOLLOW)) {
      case ENOENT:
      case ENOTDIR:
        return kj::none;
      default:
        KJ_FAIL_SYSCALL("faccessat(fd, path)", error, path) { return kj::none; }
    }
    return statToMetadata(stats);
  }